

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  type *in_RSI;
  QChar **in_RDI;
  QString *unaff_retaddr;
  QChar **in_stack_ffffffffffffffe8;
  
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>_>
  ::appendTo<QChar>(in_RSI,in_stack_ffffffffffffffe8);
  QConcatenable<QString>::appendTo(unaff_retaddr,in_RDI);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }